

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O2

Read<signed_char>
Omega_h::inertia::mark_bisection_given_axis
          (CommPtr *comm,Reals *coords,Reals *masses,Real tolerance,Vector<3> axis)

{
  Alloc *pAVar1;
  Real total_mass;
  Vector<3> center_00;
  ulong uVar2;
  Write<double> *in_RCX;
  size_t sVar3;
  void *extraout_RDX;
  Read<signed_char> RVar4;
  Vector<3> center;
  Write<double> local_c0;
  Write<double> local_b0;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_a0;
  Write<double> local_90;
  Write<double> local_80;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_70;
  Write<double> local_60;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_50;
  Vector<3> local_40;
  
  pAVar1 = (masses->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar2 = pAVar1->size;
  }
  else {
    uVar2 = (ulong)pAVar1 >> 3;
  }
  pAVar1 = (in_RCX->shared_alloc_).alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar3 = pAVar1->size;
  }
  else {
    sVar3 = (ulong)pAVar1 >> 3;
  }
  if ((int)(sVar3 >> 3) * 3 == (int)(uVar2 >> 3)) {
    std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,(__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> *)coords);
    Write<double>::Write(&local_60,in_RCX);
    total_mass = repro_sum((CommPtr *)&local_50,(Reals *)&local_60);
    Write<double>::~Write(&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_70,(__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> *)coords);
    Write<double>::Write(&local_80,&masses->write_);
    Write<double>::Write(&local_90,in_RCX);
    anon_unknown_0::get_center
              (&local_40,(CommPtr *)&local_70,(Reals *)&local_80,(Reals *)&local_90,total_mass);
    Write<double>::~Write(&local_90);
    Write<double>::~Write(&local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_a0,(__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> *)coords);
    Write<double>::Write(&local_b0,&masses->write_);
    Write<double>::Write(&local_c0,in_RCX);
    center_00.super_Few<double,_3>.array_[1] = local_40.super_Few<double,_3>.array_[1];
    center_00.super_Few<double,_3>.array_[0] = local_40.super_Few<double,_3>.array_[0];
    center_00.super_Few<double,_3>.array_[2] = local_40.super_Few<double,_3>.array_[2];
    anon_unknown_0::mark_bisection_internal
              (comm,(Reals *)&local_a0,(Reals *)&local_b0,tolerance,axis,center_00,total_mass);
    Write<double>::~Write(&local_c0);
    Write<double>::~Write(&local_b0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
    RVar4.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar4.write_.shared_alloc_.alloc = (Alloc *)comm;
    return (Read<signed_char>)RVar4.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","coords.size() == masses.size() * 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_inertia.cpp"
       ,0x9b);
}

Assistant:

Read<I8> mark_bisection_given_axis(
    CommPtr comm, Reals coords, Reals masses, Real tolerance, Vector<3> axis) {
  OMEGA_H_CHECK(coords.size() == masses.size() * 3);
  auto total_mass = repro_sum(comm, masses);
  auto center = get_center(comm, coords, masses, total_mass);
  return mark_bisection_internal(
      comm, coords, masses, tolerance, axis, center, total_mass);
}